

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O0

int rtr_update_pfx_table(rtr_socket *rtr_socket,pfx_table *pfx_table,void *pdu)

{
  long lVar1;
  pdu_type type_00;
  uint32_t erroneous_pdu_len;
  long in_FS_OFFSET;
  int local_10c;
  int rtval;
  size_t pdu_size;
  pdu_type type;
  void *pdu_local;
  pfx_table *pfx_table_local;
  rtr_socket *rtr_socket_local;
  char local_d8 [8];
  char txt_2 [16];
  char ip [46];
  char txt_1 [45];
  undefined1 local_60 [8];
  pfx_record pfxr;
  char txt [30];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (pfx_table == (pfx_table *)0x0) {
    pfxr.socket = (rtr_socket *)0x474e49524f4e4749;
    lrtr_dbg("RTR Socket: %s",&pfxr.socket);
    rtr_socket_local._4_4_ = 0;
  }
  else {
    type_00 = rtr_get_pdu_type(pdu);
    if ((type_00 != IPV4_PREFIX) && (type_00 != IPV6_PREFIX)) {
      __assert_fail("type == IPV4_PREFIX || type == IPV6_PREFIX",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/rtr/packets.c"
                    ,0x3b9,
                    "int rtr_update_pfx_table(struct rtr_socket *, struct pfx_table *, const void *)"
                   );
    }
    erroneous_pdu_len = 0x20;
    if (type_00 == IPV4_PREFIX) {
      erroneous_pdu_len = 0x14;
    }
    rtr_prefix_pdu_2_pfx_record(rtr_socket,pdu,(pfx_record *)local_60,type_00);
    if (*(char *)((long)pdu + 8) == '\x01') {
      local_10c = pfx_table_add(pfx_table,(pfx_record *)local_60);
    }
    else {
      if (*(char *)((long)pdu + 8) != '\0') {
        memcpy(ip + 0x28,"Prefix PDU with invalid flags value received",0x2d);
        lrtr_dbg("RTR Socket: %s",ip + 0x28);
        rtr_send_error_pdu_from_host(rtr_socket,pdu,erroneous_pdu_len,CORRUPT_DATA,ip + 0x28,0x2d);
        rtr_socket_local._4_4_ = -1;
        goto LAB_0010fa12;
      }
      local_10c = pfx_table_remove(pfx_table,(pfx_record *)local_60);
    }
    if (local_10c == -2) {
      lrtr_ip_addr_to_str((lrtr_ip_addr *)(local_60 + 4),txt_2 + 8,0x2e);
      lrtr_dbg("RTR Socket: Duplicate Announcement for record: %s/%u-%u, ASN: %u, received",
               txt_2 + 8,(ulong)(byte)pfxr.prefix.u.addr6.addr[2]._0_1_,
               (ulong)(byte)pfxr.prefix.u.addr6.addr[2]._1_1_,(ulong)(uint)local_60._0_4_);
      rtr_send_error_pdu_from_host
                (rtr_socket,pdu,erroneous_pdu_len,DUPLICATE_ANNOUNCEMENT,(char *)0x0,0);
      rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
      rtr_socket_local._4_4_ = -1;
    }
    else if (local_10c == -3) {
      lrtr_dbg("RTR Socket: Withdrawal of unknown record");
      rtr_send_error_pdu_from_host
                (rtr_socket,pdu,erroneous_pdu_len,WITHDRAWAL_OF_UNKNOWN_RECORD,(char *)0x0,0);
      rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
      rtr_socket_local._4_4_ = -1;
    }
    else if (local_10c == -1) {
      builtin_strncpy(local_d8,"PFX_TABL",8);
      builtin_strncpy(txt_2,"E Error",8);
      lrtr_dbg("RTR Socket: %s",local_d8);
      rtr_send_error_pdu_from_host(rtr_socket,(void *)0x0,0,INTERNAL_ERROR,local_d8,0x10);
      rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
      rtr_socket_local._4_4_ = -1;
    }
    else {
      rtr_socket_local._4_4_ = 0;
    }
  }
LAB_0010fa12:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return rtr_socket_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

static int rtr_update_pfx_table(struct rtr_socket *rtr_socket, struct pfx_table *pfx_table, const void *pdu)
{
	// the prefix table was not initialized, hence we ignore incoming ROA Objects
	if (pfx_table == NULL) {
		const char txt[] = "IGNORING INCOMING ROA OBJECTS";
		RTR_DBG("%s", txt);
		return RTR_SUCCESS;
	}

	const enum pdu_type type = rtr_get_pdu_type(pdu);

	assert(type == IPV4_PREFIX || type == IPV6_PREFIX);

	struct pfx_record pfxr;
	size_t pdu_size = (type == IPV4_PREFIX ? sizeof(struct pdu_ipv4) : sizeof(struct pdu_ipv6));

	rtr_prefix_pdu_2_pfx_record(rtr_socket, pdu, &pfxr, type);

	int rtval;

	if (((struct pdu_ipv4 *)pdu)->flags == 1) { // add record
		rtval = pfx_table_add(pfx_table, &pfxr);
	} else if (((struct pdu_ipv4 *)pdu)->flags == 0) { // remove record
		rtval = pfx_table_remove(pfx_table, &pfxr);
	} else {
		const char txt[] = "Prefix PDU with invalid flags value received";

		RTR_DBG("%s", txt);
		rtr_send_error_pdu_from_host(rtr_socket, pdu, pdu_size, CORRUPT_DATA, txt, sizeof(txt));
		return RTR_ERROR;
	}

	if (rtval == PFX_DUPLICATE_RECORD) {
		char ip[INET6_ADDRSTRLEN];

		lrtr_ip_addr_to_str(&(pfxr.prefix), ip, INET6_ADDRSTRLEN);
		RTR_DBG("Duplicate Announcement for record: %s/%u-%u, ASN: %u, received", ip, pfxr.min_len,
			pfxr.max_len, pfxr.asn);
		rtr_send_error_pdu_from_host(rtr_socket, pdu, pdu_size, DUPLICATE_ANNOUNCEMENT, NULL, 0);
		rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
		return RTR_ERROR;
	} else if (rtval == PFX_RECORD_NOT_FOUND) {
		RTR_DBG1("Withdrawal of unknown record");
		rtr_send_error_pdu_from_host(rtr_socket, pdu, pdu_size, WITHDRAWAL_OF_UNKNOWN_RECORD, NULL, 0);
		rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
		return RTR_ERROR;
	} else if (rtval == PFX_ERROR) {
		const char txt[] = "PFX_TABLE Error";

		RTR_DBG("%s", txt);
		rtr_send_error_pdu_from_host(rtr_socket, NULL, 0, INTERNAL_ERROR, txt, sizeof(txt));
		rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
		return RTR_ERROR;
	}

	return RTR_SUCCESS;
}